

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculationvisitor.cpp
# Opt level: O0

void __thiscall
CalculationVisitor::defineVariable
          (CalculationVisitor *this,BinaryOperatorExpression *expression,
          VariableExpression *variable)

{
  Environment *this_00;
  ResultValue value_00;
  Expression *pEVar1;
  string local_68;
  undefined1 auStack_48 [8];
  ResultValue value;
  VariableExpression *variable_local;
  BinaryOperatorExpression *expression_local;
  CalculationVisitor *this_local;
  
  value.mComplexValue._M_value._8_8_ = variable;
  pEVar1 = BinaryOperatorExpression::rightHandSide(expression);
  (*pEVar1->_vptr_Expression[2])(pEVar1,this,expression);
  popStack((ResultValue *)auStack_48,this);
  this_00 = this->mEnvironment;
  VariableExpression::name_abi_cxx11_
            (&local_68,(VariableExpression *)value.mComplexValue._M_value._8_8_);
  value_00.mIntValue = value._0_8_;
  value_00._0_8_ = auStack_48;
  value_00.mFloatValue = (double)value.mIntValue;
  value_00.mComplexValue._M_value._0_8_ = value.mFloatValue;
  value_00.mComplexValue._M_value._8_8_ = value.mComplexValue._M_value._0_8_;
  Environment::set(this_00,&local_68,value_00);
  std::__cxx11::string::~string((string *)&local_68);
  std::stack<ResultValue,_std::deque<ResultValue,_std::allocator<ResultValue>_>_>::push
            (&this->mEvaluationStack,(value_type *)auStack_48);
  return;
}

Assistant:

void CalculationVisitor::defineVariable(BinaryOperatorExpression* expression, VariableExpression* variable) {
	expression->rightHandSide()->accept(*this, expression);

	auto value = popStack();
	mEnvironment.set(variable->name(), value);
	mEvaluationStack.push(value);
}